

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void empty_closedir_cb(uv_fs_t *req)

{
  char *__format;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == &closedir_req) {
    eval_a = (int64_t)closedir_req.fs_type;
    eval_b = 0x21;
    if (eval_a == 0x21) {
      eval_a = closedir_req.result;
      eval_b = 0;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      pcVar2 = "0";
      pcVar1 = "req->result";
      uVar3 = 0x34;
    }
    else {
      pcVar2 = "UV_FS_CLOSEDIR";
      pcVar1 = "req->fs_type";
      uVar3 = 0x33;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar1 = "req";
    uVar3 = 0x32;
    pcVar2 = "&closedir_req";
    eval_a = (int64_t)req;
    eval_b = (int64_t)&closedir_req;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar3,pcVar1,"==",pcVar2,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void empty_closedir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &closedir_req);
  ASSERT_EQ(req->fs_type, UV_FS_CLOSEDIR);
  ASSERT_OK(req->result);
  ++empty_closedir_cb_count;
  uv_fs_req_cleanup(req);
}